

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::(anonymous_namespace)::TryConvertFacevaryingToVertexFloat<double,double>
               (vector<double,_std::allocator<double>_> *src,
               vector<double,_std::allocator<double>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,double eps)

{
  uint uVar1;
  pointer puVar2;
  _Hash_node_base *p_Var3;
  pointer pdVar4;
  pointer puVar5;
  mapped_type *pmVar6;
  __node_base _Var7;
  __hash_code __code;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  size_type __new_size;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  uint32_t vidx;
  unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  vdata;
  uint local_84;
  double local_80;
  vector<double,_std::allocator<double>_> *local_78;
  mapped_type local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<double,_std::allocator<double>_> *)0x0) {
    bVar9 = false;
  }
  else {
    puVar5 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar8 = (long)puVar2 - (long)puVar5 >> 2;
    bVar9 = false;
    if (((long)(src->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(src->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3 == uVar8) && (bVar9 = false, 2 < uVar8)) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_80 = eps;
      if (puVar2 == puVar5) {
        __new_size = 1;
      }
      else {
        uVar8 = 0;
        uVar10 = 0;
        local_78 = dst;
        do {
          local_84 = puVar5[uVar8];
          if (uVar10 < local_84) {
            uVar10 = local_84;
          }
          if (local_68._M_buckets[(ulong)local_84 % local_68._M_bucket_count] !=
              (__node_base_ptr)0x0) {
            p_Var3 = local_68._M_buckets[(ulong)local_84 % local_68._M_bucket_count]->_M_nxt;
            uVar1 = *(uint *)&p_Var3[1]._M_nxt;
            do {
              if (local_84 == uVar1) {
                pmVar6 = ::std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,&local_84);
                dVar13 = (src->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar8];
                dVar11 = ABS(*pmVar6 - dVar13);
                if (dVar11 <= local_80) goto LAB_00378f60;
                dVar12 = ABS(*pmVar6);
                dVar13 = ABS(dVar13);
                dVar14 = dVar13;
                if (dVar13 <= dVar12) {
                  dVar14 = dVar12;
                }
                if (dVar11 <= (double)(~-(ulong)NAN(dVar12) & (ulong)dVar14 |
                                      -(ulong)NAN(dVar12) & (ulong)dVar13) * local_80)
                goto LAB_00378f60;
                bVar9 = false;
                goto LAB_00378fcf;
              }
              p_Var3 = p_Var3->_M_nxt;
            } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                    (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                    (ulong)uVar1 % local_68._M_bucket_count ==
                    (ulong)local_84 % local_68._M_bucket_count));
          }
          local_70 = (src->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar8];
          pmVar6 = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_68,&local_84);
          *pmVar6 = local_70;
LAB_00378f60:
          uVar8 = uVar8 + 1;
          puVar5 = (faceVertexIndices->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)(faceVertexIndices->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >>
                                2));
        __new_size = (size_type)(uVar10 + 1);
        dst = local_78;
      }
      ::std::vector<double,_std::allocator<double>_>::resize(dst,__new_size);
      memset((dst->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,0,__new_size << 3);
      bVar9 = true;
      if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        pdVar4 = (dst->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        _Var7._M_nxt = local_68._M_before_begin._M_nxt;
        do {
          pdVar4[*(uint *)&_Var7._M_nxt[1]._M_nxt] = (double)_Var7._M_nxt[2]._M_nxt;
          _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt;
        } while (_Var7._M_nxt != (_Hash_node_base *)0x0);
      }
LAB_00378fcf:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar9;
}

Assistant:

bool TryConvertFacevaryingToVertexFloat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices, const EpsTy eps) {
  DCOUT("TryConvertFacevaryingToVertexFloat");
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    DCOUT("size mismatch.");
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i], eps)) {
        DCOUT("diff at faceVertexIndices[" << i << "]");
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}